

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char8_t_*>::Print(char8_t *str,ostream *os)

{
  allocator<char8_t> local_39;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_38;
  ostream *local_18;
  ostream *os_local;
  char8_t *str_local;
  
  local_18 = os;
  os_local = (ostream *)str;
  if (str == (char8_t *)0x0) {
    std::operator<<(os,"NULL");
  }
  else {
    std::allocator<char8_t>::allocator(&local_39);
    std::__cxx11::u8string::u8string<std::allocator<char8_t>>((u8string *)&local_38,str,&local_39);
    UniversalPrint<std::__cxx11::u8string>(&local_38,local_18);
    std::__cxx11::u8string::~u8string((u8string *)&local_38);
    std::allocator<char8_t>::~allocator(&local_39);
  }
  return;
}

Assistant:

static void Print(const char8_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u8string(str), os);
    }
  }